

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2.cc
# Opt level: O0

bool re2::RE2::FindAndConsumeN(StringPiece *input,RE2 *re,Arg **args,int n)

{
  bool bVar1;
  StringPiece *in_RDI;
  size_t consumed;
  int in_stack_00000334;
  Arg **in_stack_00000338;
  size_t *in_stack_00000340;
  Anchor in_stack_0000034c;
  StringPiece *in_stack_00000350;
  RE2 *in_stack_00000358;
  undefined8 local_30;
  
  bVar1 = DoMatch(in_stack_00000358,in_stack_00000350,in_stack_0000034c,in_stack_00000340,
                  in_stack_00000338,in_stack_00000334);
  if (bVar1) {
    StringPiece::remove_prefix(in_RDI,local_30);
  }
  return bVar1;
}

Assistant:

bool RE2::FindAndConsumeN(StringPiece* input, const RE2& re,
                          const Arg* const args[], int n) {
  size_t consumed;
  if (re.DoMatch(*input, UNANCHORED, &consumed, args, n)) {
    input->remove_prefix(consumed);
    return true;
  } else {
    return false;
  }
}